

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,string *componentName)

{
  mapped_type *component;
  string suffix;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_38,"packages/",(allocator *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"/data",(allocator *)&bStack_98);
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    GetRootPackageName_abi_cxx11_(&local_78,this);
    std::operator+(&bStack_98,&local_38,&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,&local_58);
  }
  else {
    component = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&(this->super_cmCPackGenerator).Components,componentName);
    GetComponentPackageName_abi_cxx11_(&local_78,this,component);
    std::operator+(&bStack_98,&local_38,&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,&local_58);
  }
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  const std::string prefix = "packages/";
  const std::string suffix = "/data";

  if (componentPackageMethod == ONE_PACKAGE) {
  return std::string(prefix + GetRootPackageName() + suffix);
  }

  return prefix
    + GetComponentPackageName(&Components[componentName])
    + suffix;
}